

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Algorithms.cpp
# Opt level: O3

int __thiscall Algorithms::mobiusFunction(Algorithms *this,BigInteger *n)

{
  ulong uVar1;
  pointer piVar2;
  bool bVar3;
  ulong uVar4;
  pointer piVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  vector<BigIntegerLibrary::BigInteger,_std::allocator<BigIntegerLibrary::BigInteger>_> fact;
  BigInteger local_60;
  BigInteger local_40;
  
  BigIntegerLibrary::BigInteger::BigInteger(&local_60,1);
  bVar3 = BigIntegerLibrary::BigInteger::operator==(n,&local_60);
  if (local_60.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  uVar6 = 1;
  if (!bVar3) {
    BigIntegerLibrary::BigInteger::BigInteger(&local_40,n);
    factorization((vector<BigIntegerLibrary::BigInteger,_std::allocator<BigIntegerLibrary::BigInteger>_>
                   *)&local_60,this,&local_40);
    if (local_40.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_40.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_40.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_40.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    piVar2 = local_60.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    piVar5 = local_60.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (local_60.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_60.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      uVar4 = (long)local_60.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_60.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 5;
      lVar7 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar7 == 0; lVar7 = lVar7 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<BigIntegerLibrary::BigInteger*,std::vector<BigIntegerLibrary::BigInteger,std::allocator<BigIntegerLibrary::BigInteger>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (local_60.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 local_60.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,((uint)lVar7 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<BigIntegerLibrary::BigInteger*,std::vector<BigIntegerLibrary::BigInteger,std::allocator<BigIntegerLibrary::BigInteger>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (piVar5,piVar2);
      piVar5 = local_60.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
    }
    uVar6 = 0xffffffff;
    if (0x20 < (ulong)((long)piVar5 -
                      (long)local_60.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start)) {
      lVar7 = 0;
      uVar4 = 0;
      do {
        bVar3 = BigIntegerLibrary::BigInteger::operator!=
                          ((BigInteger *)
                           ((long)local_60.num.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                  .super__Vector_impl_data._M_start + lVar7 + 0x20),
                           (BigInteger *)
                           ((long)local_60.num.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                  .super__Vector_impl_data._M_start + lVar7));
        if (!bVar3) {
          uVar6 = 0;
          goto LAB_00108f4f;
        }
        uVar1 = uVar4 + 1;
        lVar7 = lVar7 + 0x20;
        uVar8 = uVar4 + 2;
        uVar4 = uVar1;
      } while (uVar8 < (ulong)((long)local_60.num.super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                               (long)local_60.num.super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_start >> 5));
      uVar6 = -(uint)((uVar1 & 1) == 0) | 1;
    }
LAB_00108f4f:
    std::vector<BigIntegerLibrary::BigInteger,_std::allocator<BigIntegerLibrary::BigInteger>_>::
    ~vector((vector<BigIntegerLibrary::BigInteger,_std::allocator<BigIntegerLibrary::BigInteger>_> *
            )&local_60);
  }
  return uVar6;
}

Assistant:

int Algorithms::mobiusFunction(BigInteger n) {
    if (n == BigInteger(1)) {
        return 1;
    }
    auto fact = factorization(n);
    sort(fact.begin(), fact.end());
    int k = 1;
    for (int i = 1; i < fact.size(); ++i) {
        if (fact[i] != fact[i - 1]) {
            ++k;
        } else {
            return 0; // n % fact[i]^2 == 0
        }
    }
    if (k % 2) {
        return -1;
    }
    return 1;
}